

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToaster.cpp
# Opt level: O1

Converter * PixelToaster::requestConverter(Format source,Format destination)

{
  undefined **ppuVar1;
  
  if (source.enumeration == XRGB8888) {
    if (8 < destination.enumeration - XRGB8888) {
      return (Converter *)0x0;
    }
    ppuVar1 = &PTR_converter_XRGB8888_to_XRGB8888_0010cd70;
  }
  else {
    if ((source.enumeration != XBGRFFFF) || (8 < destination.enumeration - XRGB8888)) {
      return (Converter *)0x0;
    }
    ppuVar1 = &PTR_converter_XBGRFFFF_to_XRGB8888_0010cd28;
  }
  return (Converter *)ppuVar1[destination.enumeration - XRGB8888];
}

Assistant:

PIXELTOASTER_API PixelToaster::Converter* PixelToaster::requestConverter(PixelToaster::Format source, PixelToaster::Format destination)
{
    if (source == Format::XBGRFFFF)
    {
        switch (destination)
        {
            case Format::XBGRFFFF: return &converter_XBGRFFFF_to_XBGRFFFF;
            case Format::XRGB8888: return &converter_XBGRFFFF_to_XRGB8888;
            case Format::XBGR8888: return &converter_XBGRFFFF_to_XBGR8888;
            case Format::RGB888: return &converter_XBGRFFFF_to_RGB888;
            case Format::BGR888: return &converter_XBGRFFFF_to_BGR888;
            case Format::RGB565: return &converter_XBGRFFFF_to_RGB565;
            case Format::BGR565: return &converter_XBGRFFFF_to_BGR565;
            case Format::XRGB1555: return &converter_XBGRFFFF_to_XRGB1555;
            case Format::XBGR1555: return &converter_XBGRFFFF_to_XBGR1555;

            default:
                return nullptr;
        }
    }
    else if (source == Format::XRGB8888)
    {
        switch (destination)
        {
            case Format::XBGRFFFF: return &converter_XRGB8888_to_XBGRFFFF;
            case Format::XRGB8888: return &converter_XRGB8888_to_XRGB8888;
            case Format::XBGR8888: return &converter_XRGB8888_to_XBGR8888;
            case Format::RGB888: return &converter_XRGB8888_to_RGB888;
            case Format::BGR888: return &converter_XRGB8888_to_BGR888;
            case Format::RGB565: return &converter_XRGB8888_to_RGB565;
            case Format::BGR565: return &converter_XRGB8888_to_BGR565;
            case Format::XRGB1555: return &converter_XRGB8888_to_XRGB1555;
            case Format::XBGR1555: return &converter_XRGB8888_to_XBGR1555;

            default:
                return nullptr;
        }
    }

    return nullptr;
}